

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_psbt.cpp
# Opt level: O0

void cfd::js::api::SetPsbtInputData(Psbt *psbt,PsbtInputRequestStruct *request)

{
  undefined4 uVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_> *this;
  uint uVar7;
  ByteData local_5a0;
  ByteData local_588;
  reference local_570;
  PsbtMapDataStruct *data;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>
  *__range2_1;
  ByteData local_538;
  allocator local_519;
  string local_518 [32];
  Pubkey local_4f8;
  KeyData local_4e0;
  Pubkey local_390;
  reference local_378;
  SignParameter *signature;
  iterator __end2;
  iterator __begin2;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *__range2;
  Script local_308;
  undefined1 local_2d0 [8];
  Script script;
  Script local_248;
  undefined1 local_210 [8];
  TxOut current_txout;
  Transaction current_tx;
  undefined1 local_180 [8];
  Script redeem_script;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  SigHashType sighash_type;
  undefined1 local_120 [8];
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> signatures;
  Transaction utxo_full_tx;
  undefined1 local_c8 [8];
  TxOut witness_utxo;
  Txid local_68;
  undefined1 local_48 [8];
  OutPoint outpoint;
  uint32_t index;
  PsbtInputRequestStruct *request_local;
  Psbt *psbt_local;
  
  outpoint._36_4_ = request->index;
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    cfd::core::Txid::Txid(&local_68,(string *)request);
    cfd::core::OutPoint::OutPoint((OutPoint *)local_48,&local_68,(request->outpoint).vout);
    core::Txid::~Txid(&local_68);
    outpoint._36_4_ = cfd::Psbt::GetTxInIndex((OutPoint *)psbt);
    core::OutPoint::~OutPoint((OutPoint *)local_48);
  }
  cfd::core::TxOut::TxOut((TxOut *)local_c8);
  cfd::core::Transaction::Transaction
            ((Transaction *)
             &signatures.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)local_120);
  cfd::core::SigHashType::SigHashType
            ((SigHashType *)
             ((long)&key_list.
                     super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),kSigHashUnknown,false,
             false);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
             &redeem_script.field_0x30);
  cfd::core::Script::Script((Script *)local_180);
  ParsePsbtInputRequest
            (&request->input,(TxOut *)local_c8,
             (Transaction *)
             &signatures.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)local_120,
             (SigHashType *)
             ((long)&key_list.
                     super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
             (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
             &redeem_script.field_0x30,(Script *)local_180);
  bVar3 = SUB81(psbt,0);
  cfd::core::Psbt::GetTxInUtxoFull
            ((int)&current_txout + 0x48,bVar3,(bool *)(ulong)(uint)outpoint._36_4_);
  cfd::core::Psbt::GetTxInUtxo((uint)local_210,bVar3,(bool *)(ulong)(uint)outpoint._36_4_);
  uVar5 = cfd::core::Transaction::GetTotalSize();
  uVar7 = (uint)psbt;
  if (uVar5 < 0xb) {
    cfd::core::AbstractTxOut::GetLockingScript();
    bVar4 = cfd::core::Script::IsEmpty();
    core::Script::~Script(&local_248);
    uVar1 = outpoint._36_4_;
    if (((bVar4 ^ 0xff) & 1) == 0) {
      bVar2 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::empty
                        ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                         &redeem_script.field_0x30);
      if ((!bVar2) || (bVar4 = cfd::core::Script::IsEmpty(), (bVar4 & 1) == 0)) {
        cfd::core::Psbt::GetTxInRedeemScript
                  ((uint)local_2d0,bVar3,(bool *)(ulong)(uint)outpoint._36_4_);
        bVar4 = cfd::core::Script::IsEmpty();
        if ((bVar4 & 1) == 0) {
          cfd::core::Script::operator=((Script *)local_2d0,(Script *)local_180);
        }
        uVar5 = cfd::core::Transaction::GetTotalSize();
        if (uVar5 < 0xb) {
          cfd::core::AbstractTxOut::GetLockingScript();
          bVar4 = cfd::core::Script::IsEmpty();
          core::Script::~Script(&local_308);
          uVar1 = outpoint._36_4_;
          if (((bVar4 ^ 0xff) & 1) != 0) {
            cfd::core::TxOutReference::TxOutReference
                      ((TxOutReference *)&__range2,(TxOut *)local_210);
            cfd::core::Psbt::SetTxInUtxo
                      (uVar7,(TxOutReference *)(ulong)(uint)uVar1,(Script *)&__range2,
                       (vector *)local_2d0);
            core::TxOutReference::~TxOutReference((TxOutReference *)&__range2);
          }
        }
        else {
          cfd::core::Psbt::SetTxInUtxo
                    (uVar7,(Transaction *)(ulong)(uint)outpoint._36_4_,
                     (Script *)&current_txout.field_0x48,(vector *)local_2d0);
        }
        core::Script::~Script((Script *)local_2d0);
      }
    }
    else {
      cfd::core::TxOutReference::TxOutReference
                ((TxOutReference *)&script.field_0x30,(TxOut *)local_c8);
      cfd::core::Psbt::SetTxInUtxo
                (uVar7,(TxOutReference *)(ulong)(uint)uVar1,(Script *)&script.field_0x30,
                 (vector *)local_180);
      core::TxOutReference::~TxOutReference((TxOutReference *)&script.field_0x30);
    }
  }
  else {
    cfd::core::Psbt::SetTxInUtxo
              (uVar7,(Transaction *)(ulong)(uint)outpoint._36_4_,
               (Script *)
               &signatures.
                super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(vector *)local_180);
  }
  __end2 = std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::begin
                     ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)local_120);
  signature = (SignParameter *)
              std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::end
                        ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                         local_120);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                                     *)&signature), bVar3) {
    local_378 = __gnu_cxx::
                __normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                ::operator*(&__end2);
    cfd::SignParameter::GetRelatedPubkey();
    bVar4 = cfd::core::Pubkey::IsValid();
    core::Pubkey::~Pubkey(&local_390);
    uVar1 = outpoint._36_4_;
    if ((bVar4 & 1) != 0) {
      cfd::SignParameter::GetRelatedPubkey();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_518,"",&local_519);
      cfd::core::ByteData::ByteData(&local_538);
      cfd::core::KeyData::KeyData(&local_4e0,&local_4f8,local_518,&local_538);
      cfd::SignParameter::GetData();
      cfd::core::Psbt::SetTxInSignature(uVar7,(KeyData *)(ulong)(uint)uVar1,(ByteData *)&local_4e0);
      core::ByteData::~ByteData((ByteData *)&__range2_1);
      core::KeyData::~KeyData(&local_4e0);
      core::ByteData::~ByteData(&local_538);
      std::__cxx11::string::~string(local_518);
      std::allocator<char>::~allocator((allocator<char> *)&local_519);
      core::Pubkey::~Pubkey(&local_4f8);
    }
    __gnu_cxx::
    __normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
    ::operator++(&__end2);
  }
  bVar4 = cfd::core::SigHashType::IsValid();
  if ((bVar4 & 1) != 0) {
    cfd::core::Psbt::SetTxInSighashType(uVar7,(SigHashType *)(ulong)(uint)outpoint._36_4_);
  }
  this = &(request->input).unknown;
  __end2_1 = std::
             vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>
             ::begin(this);
  data = (PsbtMapDataStruct *)
         std::
         vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>::
         end(this);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<const_cfd::js::api::PsbtMapDataStruct_*,_std::vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>_>
                             *)&data), bVar3) {
    local_570 = __gnu_cxx::
                __normal_iterator<const_cfd::js::api::PsbtMapDataStruct_*,_std::vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>_>
                ::operator*(&__end2_1);
    uVar1 = outpoint._36_4_;
    cfd::core::ByteData::ByteData(&local_588,(string *)local_570);
    cfd::core::ByteData::ByteData(&local_5a0,(string *)&local_570->value);
    cfd::core::Psbt::SetTxInRecord(uVar7,(ByteData *)(ulong)(uint)uVar1,&local_588);
    core::ByteData::~ByteData(&local_5a0);
    core::ByteData::~ByteData(&local_588);
    __gnu_cxx::
    __normal_iterator<const_cfd::js::api::PsbtMapDataStruct_*,_std::vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>_>
    ::operator++(&__end2_1);
  }
  core::TxOut::~TxOut((TxOut *)local_210);
  core::Transaction::~Transaction((Transaction *)&current_txout.field_0x48);
  core::Script::~Script((Script *)local_180);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
             &redeem_script.field_0x30);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)local_120);
  core::Transaction::~Transaction
            ((Transaction *)
             &signatures.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  core::TxOut::~TxOut((TxOut *)local_c8);
  return;
}

Assistant:

static void SetPsbtInputData(
    Psbt* psbt, const PsbtInputRequestStruct& request) {
  uint32_t index = request.index;
  if (!request.outpoint.txid.empty()) {
    OutPoint outpoint(Txid(request.outpoint.txid), request.outpoint.vout);
    index = psbt->GetTxInIndex(outpoint);
  }

  TxOut witness_utxo;
  Transaction utxo_full_tx;
  std::vector<SignParameter> signatures;
  SigHashType sighash_type(SigHashAlgorithm::kSigHashUnknown);
  std::vector<KeyData> key_list;
  Script redeem_script;
  ParsePsbtInputRequest(
      request.input, &witness_utxo, &utxo_full_tx, &signatures, &sighash_type,
      &key_list, &redeem_script);

  Transaction current_tx = psbt->GetTxInUtxoFull(index, true);
  TxOut current_txout = psbt->GetTxInUtxo(index, true);
  if (utxo_full_tx.GetTotalSize() > Transaction::kTransactionMinimumSize) {
    psbt->SetTxInUtxo(index, utxo_full_tx, redeem_script, key_list);
  } else if (!witness_utxo.GetLockingScript().IsEmpty()) {
    psbt->SetTxInUtxo(
        index, TxOutReference(witness_utxo), redeem_script, key_list);
  } else if ((!key_list.empty()) || (!redeem_script.IsEmpty())) {
    auto script = psbt->GetTxInRedeemScript(index, true);
    if (!redeem_script.IsEmpty()) script = redeem_script;
    if (current_tx.GetTotalSize() > Transaction::kTransactionMinimumSize) {
      psbt->SetTxInUtxo(index, current_tx, script, key_list);
    } else if (!current_txout.GetLockingScript().IsEmpty()) {
      psbt->SetTxInUtxo(
          index, TxOutReference(current_txout), script, key_list);
    }
  }

  for (const auto& signature : signatures) {
    if (signature.GetRelatedPubkey().IsValid()) {
      psbt->SetTxInSignature(
          index, KeyData(signature.GetRelatedPubkey(), "", ByteData()),
          signature.GetData());
    }
  }

  if (sighash_type.IsValid()) {
    psbt->SetTxInSighashType(index, sighash_type);
  }

  for (const auto& data : request.input.unknown) {
    psbt->SetTxInRecord(index, ByteData(data.key), ByteData(data.value));
  }
}